

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

wchar_t add_pattern_mbs(archive_match *a,match_list *list,char *pattern)

{
  undefined4 uVar1;
  undefined4 uVar2;
  match *pmVar3;
  size_t sVar4;
  size_t len;
  wchar_t wVar5;
  
  pmVar3 = (match *)calloc(1,0x78);
  if (pmVar3 == (match *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    (a->archive).state = 0x8000;
    wVar5 = L'\xffffffe2';
  }
  else {
    sVar4 = strlen(pattern);
    wVar5 = L'\0';
    if (sVar4 == 0) {
      len = 0;
    }
    else {
      len = sVar4 - (pattern[sVar4 - 1] == '/');
    }
    archive_mstring_copy_mbs_len(&pmVar3->pattern,pattern,len);
    *list->last = pmVar3;
    list->last = (match **)pmVar3;
    uVar1 = list->count;
    uVar2 = list->unmatched_count;
    list->count = uVar1 + 1;
    list->unmatched_count = uVar2 + 1;
    *(byte *)&a->setflag = (byte)a->setflag | 1;
  }
  return wVar5;
}

Assistant:

static int
add_pattern_mbs(struct archive_match *a, struct match_list *list,
    const char *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = strlen(pattern);
	if (len && pattern[len - 1] == '/')
		--len;
	archive_mstring_copy_mbs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}